

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * Pathie::Path::data_dirs(void)

{
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *in_RDI;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"XDG_DATA_DIRS",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"/usr/local/share/:/usr/share/",&local_69);
  get_xdg_dirlist(in_RDI,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::vector<Path> Path::data_dirs()
{
  return get_xdg_dirlist("XDG_DATA_DIRS", "/usr/local/share/:/usr/share/");
}